

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

int y4m_input_fetch_frame(y4m_input *_y4m,FILE *_fin,aom_image_t *_img)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  char *__ptr;
  bool bVar8;
  size_t sStack_50;
  char c;
  uint local_3c;
  char frame [6];
  
  uVar7 = _y4m->bit_depth;
  iVar4 = file_read(frame,6,_fin);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = bcmp(frame,"FRAME",5);
    if (iVar4 == 0) {
      if (frame[5] != '\n') {
        iVar4 = 0x50;
        local_3c = uVar7;
        do {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            __ptr = "Error parsing Y4M frame header\n";
            sStack_50 = 0x1f;
            goto LAB_001241ac;
          }
          iVar5 = file_read(&c,1,_fin);
          uVar7 = local_3c;
        } while ((iVar5 != 0) && (c != '\n'));
      }
      iVar4 = file_read(_y4m->dst_buf,_y4m->dst_buf_read_sz,_fin);
      if ((iVar4 != 0) && (iVar4 = file_read(_y4m->aux_buf,_y4m->aux_buf_read_sz,_fin), iVar4 != 0))
      {
        bVar8 = 8 < uVar7;
        (*_y4m->convert)(_y4m,_y4m->dst_buf,_y4m->aux_buf);
        memset(_img,0,0xa8);
        _img->fmt = _y4m->aom_fmt;
        uVar2 = _y4m->pic_w;
        uVar3 = _y4m->pic_h;
        _img->d_h = uVar3;
        uVar7 = _y4m->bit_depth;
        _img->w = uVar2;
        _img->h = uVar3;
        _img->bit_depth = uVar7;
        _img->d_w = uVar2;
        iVar4 = _y4m->dst_c_dec_h;
        _img->x_chroma_shift = iVar4 >> 1;
        iVar5 = _y4m->dst_c_dec_v;
        _img->y_chroma_shift = iVar5 >> 1;
        _img->bps = _y4m->bps;
        iVar4 = (int)(uVar2 + iVar4 + -1) / iVar4 << bVar8;
        _img->stride[0] = uVar2 << bVar8;
        _img->stride[2] = iVar4;
        _img->stride[1] = iVar4;
        puVar1 = _y4m->dst_buf;
        _img->planes[0] = puVar1;
        lVar6 = (long)(int)(uVar3 * uVar2 << bVar8);
        _img->planes[1] = puVar1 + lVar6;
        _img->planes[2] = _y4m->dst_buf + ((int)(uVar3 + iVar5 + -1) / iVar5) * iVar4 + lVar6;
        return 1;
      }
      __ptr = "Error reading Y4M frame data.\n";
      sStack_50 = 0x1e;
    }
    else {
      __ptr = "Loss of framing in Y4M input data\n";
      sStack_50 = 0x22;
    }
LAB_001241ac:
    fwrite(__ptr,sStack_50,1,_stderr);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int y4m_input_fetch_frame(y4m_input *_y4m, FILE *_fin, aom_image_t *_img) {
  char frame[6];
  int pic_sz;
  int c_w;
  int c_h;
  int c_sz;
  int bytes_per_sample = _y4m->bit_depth > 8 ? 2 : 1;
  /*Read and skip the frame header.*/
  if (!file_read(frame, 6, _fin)) return 0;
  if (memcmp(frame, "FRAME", 5)) {
    fprintf(stderr, "Loss of framing in Y4M input data\n");
    return -1;
  }
  if (frame[5] != '\n') {
    char c;
    int j;
    for (j = 0; j < 79 && file_read(&c, 1, _fin) && c != '\n'; j++) {
    }
    if (j == 79) {
      fprintf(stderr, "Error parsing Y4M frame header\n");
      return -1;
    }
  }
  /*Read the frame data that needs no conversion.*/
  if (!file_read(_y4m->dst_buf, _y4m->dst_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Read the frame data that does need conversion.*/
  if (!file_read(_y4m->aux_buf, _y4m->aux_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Now convert the just read frame.*/
  (*_y4m->convert)(_y4m, _y4m->dst_buf, _y4m->aux_buf);
  /*Fill in the frame buffer pointers.
    We don't use aom_img_wrap() because it forces padding for odd picture
     sizes, which would require a separate fread call for every row.*/
  memset(_img, 0, sizeof(*_img));
  /*Y4M has the planes in Y'CbCr order, which libaom calls Y, U, and V.*/
  _img->fmt = _y4m->aom_fmt;
  _img->w = _img->d_w = _y4m->pic_w;
  _img->h = _img->d_h = _y4m->pic_h;
  _img->bit_depth = _y4m->bit_depth;
  _img->x_chroma_shift = _y4m->dst_c_dec_h >> 1;
  _img->y_chroma_shift = _y4m->dst_c_dec_v >> 1;
  _img->bps = _y4m->bps;

  /*Set up the buffer pointers.*/
  pic_sz = _y4m->pic_w * _y4m->pic_h * bytes_per_sample;
  c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_w *= bytes_per_sample;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  _img->stride[AOM_PLANE_Y] = _y4m->pic_w * bytes_per_sample;
  _img->stride[AOM_PLANE_U] = _img->stride[AOM_PLANE_V] = c_w;
  _img->planes[AOM_PLANE_Y] = _y4m->dst_buf;
  _img->planes[AOM_PLANE_U] = _y4m->dst_buf + pic_sz;
  _img->planes[AOM_PLANE_V] = _y4m->dst_buf + pic_sz + c_sz;
  return 1;
}